

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

uint __thiscall Kernel::Clause::computeWeightForClauseSelection(Clause *this,Options *opt)

{
  bool bVar1;
  uint uVar2;
  Options *in_RSI;
  long in_RDI;
  NonVariableNonTypeIterator it;
  uint i;
  bool found;
  bool derivedFromGoal;
  uint numeralWeight;
  uint splWeight;
  uint w;
  Clause *in_stack_000000d0;
  uint in_stack_ffffffffffffff5c;
  Signature *in_stack_ffffffffffffff60;
  Options *in_stack_ffffffffffffff70;
  Term *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  NonVariableNonTypeIterator *in_stack_ffffffffffffffa0;
  uint local_24;
  
  if (*(int *)(in_RDI + 0x40) == 0) {
    computeWeight((Clause *)in_stack_ffffffffffffff60);
  }
  bVar1 = Shell::Options::nonliteralsInClauseWeight(in_RSI);
  if (bVar1) {
    splitWeight((Clause *)in_stack_ffffffffffffff60);
  }
  bVar1 = Shell::Options::increasedNumeralWeight(in_RSI);
  if (bVar1) {
    getNumeralWeight(in_stack_000000d0);
  }
  bVar1 = Unit::derivedFromGoal((Unit *)0x84470f);
  if ((bVar1) && (bVar1 = Shell::Options::restrictNWCtoGC(in_RSI), bVar1)) {
    for (local_24 = 0; local_24 < ((uint)*(undefined8 *)(in_RDI + 0x38) & 0xfffff);
        local_24 = local_24 + 1) {
      NonVariableNonTypeIterator::NonVariableNonTypeIterator
                ((NonVariableNonTypeIterator *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0));
      while( true ) {
        bVar1 = NonVariableNonTypeIterator::hasNext((NonVariableNonTypeIterator *)0x844795);
        in_stack_ffffffffffffff84 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff84);
        if (!bVar1) break;
        in_stack_ffffffffffffff70 = DAT_01333830;
        in_stack_ffffffffffffff78 = NonVariableNonTypeIterator::next(in_stack_ffffffffffffffa0);
        Term::functor(in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff60 =
             (Signature *)
             Signature::getFunction(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        bVar1 = Signature::Symbol::inGoal((Symbol *)in_stack_ffffffffffffff60);
        in_stack_ffffffffffffff5c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
      }
      NonVariableNonTypeIterator::~NonVariableNonTypeIterator
                ((NonVariableNonTypeIterator *)in_stack_ffffffffffffff60);
    }
  }
  uVar2 = computeWeightForClauseSelection
                    (in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                     (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0),in_stack_ffffffffffffff70);
  return uVar2;
}

Assistant:

unsigned Clause::computeWeightForClauseSelection(const Options& opt) const
{
  unsigned w = 0;
  if (_weight) {
    w = _weight;
  } else {
    w = computeWeight();
  }

  unsigned splWeight = 0;
  if (opt.nonliteralsInClauseWeight()) {
    splWeight = splitWeight(); // no longer includes propWeight
  }

  // hack: computation of getNumeralWeight is potentially expensive, so we only compute it if
  // the option increasedNumeralWeight is set to true.
  unsigned numeralWeight = 0;
  if (opt.increasedNumeralWeight())
  {
    numeralWeight = getNumeralWeight();
  }

  bool derivedFromGoal = Unit::derivedFromGoal();
  if(derivedFromGoal && opt.restrictNWCtoGC()){
    bool found = false;
    for(unsigned i=0;i<_length;i++){
      NonVariableNonTypeIterator it(_literals[i]);
      while(it.hasNext()){
        found |= env.signature->getFunction(it.next()->functor())->inGoal();
      }
    }
    if(!found){ derivedFromGoal=false; }
  }

  return Clause::computeWeightForClauseSelection(w, splWeight, numeralWeight, derivedFromGoal, opt);
}